

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O0

void __thiscall AsyncLogging::append(AsyncLogging *this,char *logline,int len)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  int in_EDX;
  FixedBuffer<4000000> *in_RDI;
  MutexLockGuard lock;
  MutexLock *in_stack_ffffffffffffffb8;
  FixedBuffer<4000000> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd4;
  
  MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x109c0e);
  iVar2 = FixedBuffer<4000000>::avail(in_stack_ffffffffffffffc0);
  if (in_EDX < iVar2) {
    std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x109c37);
    FixedBuffer<4000000>::append
              ((FixedBuffer<4000000> *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),in_RDI->data_,
               (size_t)in_stack_ffffffffffffffc0);
  }
  else {
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),(value_type *)in_RDI);
    this_00 = std::
              __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x109c91);
    FixedBuffer<4000000>::reset(this_00);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
                        in_RDI->data_ + 0x16));
    if (bVar1) {
      std::shared_ptr<FixedBuffer<4000000>_>::operator=
                ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_ffffffffffffffc0,
                 (shared_ptr<FixedBuffer<4000000>_> *)in_stack_ffffffffffffffb8);
    }
    else {
      in_stack_ffffffffffffffc0 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
      FixedBuffer<4000000>::FixedBuffer(in_stack_ffffffffffffffc0);
      std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
      reset<FixedBuffer<4000000>>
                ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(in_stack_ffffffffffffffd4,iVar2),in_RDI);
    }
    std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x109d3d);
    FixedBuffer<4000000>::append
              ((FixedBuffer<4000000> *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),in_RDI->data_,
               (size_t)in_stack_ffffffffffffffc0);
    Condition::notify((Condition *)0x109d62);
  }
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x109d70);
  return;
}

Assistant:

void AsyncLogging::append(const char *logline, int len){
    MutexLockGuard lock(mutex_);
    if(currentBuffer_->avail() > len){
        currentBuffer_->append(logline, len);
    }else {
        buffers_.push_back(currentBuffer_);
        currentBuffer_->reset();
        if(nextBuffer_){
            currentBuffer_ = std::move(nextBuffer_);
        }else {
            currentBuffer_.reset(new Buffer);
        }
        currentBuffer_->append(logline, len);
        cond_.notify();
    }
}